

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Preface::Copy(Preface *this,Preface *rhs)

{
  undefined8 uVar1;
  
  (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue =
       (rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)
           ((rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value
       = *(undefined8 *)
          (rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value;
  *(undefined8 *)
   ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_HasValue =
       (rhs->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)
           ((rhs->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value + 8) =
       uVar1;
  (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_HasValue =
       (rhs->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)
           ((rhs->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value +
           8);
  *(undefined8 *)
   (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)
        (rhs->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value;
  *(undefined8 *)
   ((this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value + 8) =
       uVar1;
  (this->super_InterchangeObject).GenerationUID.m_has_value =
       (rhs->super_InterchangeObject).GenerationUID.m_has_value;
  Kumu::Timestamp::operator=(&this->LastModifiedDate,&rhs->LastModifiedDate);
  this->Version = rhs->Version;
  (this->ObjectModelVersion).m_has_value = (rhs->ObjectModelVersion).m_has_value;
  (this->ObjectModelVersion).m_property = (rhs->ObjectModelVersion).m_property;
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_HasValue =
       (rhs->PrimaryPackage).m_property.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->PrimaryPackage).m_property.super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->PrimaryPackage).m_property.super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->PrimaryPackage).m_has_value = (rhs->PrimaryPackage).m_has_value;
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::operator=
            (&(this->Identifications).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
             &(rhs->Identifications).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>);
  (this->ContentStorage).super_Identifier<16U>.m_HasValue =
       (rhs->ContentStorage).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->ContentStorage).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->ContentStorage).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->ContentStorage).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->ContentStorage).super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->OperationalPattern).super_Identifier<16U>.m_HasValue =
       (rhs->OperationalPattern).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->OperationalPattern).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->OperationalPattern).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->OperationalPattern).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->OperationalPattern).super_Identifier<16U>.m_Value + 8) = uVar1;
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::operator=(&(this->EssenceContainers).
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t,
              &(rhs->EssenceContainers).
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::operator=(&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t,
              &(rhs->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::operator=(&(this->ApplicationSchemes).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t,
              &(rhs->ApplicationSchemes).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  (this->ApplicationSchemes).m_has_value = (rhs->ApplicationSchemes).m_has_value;
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::operator=(&(this->ConformsToSpecifications).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t,
              &(rhs->ConformsToSpecifications).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  (this->ConformsToSpecifications).m_has_value = (rhs->ConformsToSpecifications).m_has_value;
  return;
}

Assistant:

void
ASDCP::MXF::Preface::Copy(const Preface& rhs)
{
  InterchangeObject::Copy(rhs);

  LastModifiedDate = rhs.LastModifiedDate;
  Version = rhs.Version;
  ObjectModelVersion = rhs.ObjectModelVersion;
  PrimaryPackage = rhs.PrimaryPackage;
  Identifications = rhs.Identifications;
  ContentStorage = rhs.ContentStorage;
  OperationalPattern = rhs.OperationalPattern;
  EssenceContainers = rhs.EssenceContainers;
  DMSchemes = rhs.DMSchemes;
  ApplicationSchemes = rhs.ApplicationSchemes;
  ConformsToSpecifications = rhs.ConformsToSpecifications;
}